

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void gam_LocationF(int proc,Integer g_handle,Integer *subscript,char **ptr_loc,Integer *ld)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long lVar5;
  long in_RSI;
  int in_EDI;
  long *in_R8;
  char err_string [256];
  Integer _d_3;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _p_handle;
  Integer _pinv;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d;
  Integer _offset;
  char acStackY_2c8 [256];
  ulong local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8 [7];
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178 [10];
  int local_150;
  int local_14c;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  long local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_d0;
  long local_c8 [8];
  long local_88 [7];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long *local_28;
  undefined8 *local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_30 = 0;
  local_48 = 1;
  local_50 = (long)(GA[in_RSI].ndim + -1);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  if (GA[in_RSI].distr_type == 0) {
    if (GA[in_RSI].num_rstrctd == 0) {
      lVar3 = (long)GA[in_RSI].ndim;
      local_108 = 0;
      local_e8 = 1;
      for (local_f0 = 0; local_f0 < lVar3; local_f0 = local_f0 + 1) {
        local_e8 = GA[in_RSI].nblock[local_f0] * local_e8;
      }
      if ((local_e8 + -1 < (long)in_EDI) || (in_EDI < 0)) {
        for (local_f0 = 0; local_f0 < lVar3; local_f0 = local_f0 + 1) {
          local_88[local_f0] = 0;
          local_c8[local_f0] = -1;
        }
      }
      else {
        local_f8 = (long)in_EDI;
        for (local_f0 = 0; local_f0 < lVar3; local_f0 = local_f0 + 1) {
          lVar5 = local_f8 % (long)GA[local_10].nblock[local_f0];
          local_f8 = local_f8 / (long)GA[local_10].nblock[local_f0];
          lVar4 = lVar5 + local_108;
          local_108 = GA[local_10].nblock[local_f0] + local_108;
          local_88[local_f0] = GA[local_10].mapc[lVar4];
          if (lVar5 == GA[local_10].nblock[local_f0] + -1) {
            local_c8[local_f0] = GA[local_10].dims[local_f0];
          }
          else {
            local_c8[local_f0] = GA[local_10].mapc[lVar4 + 1] + -1;
          }
        }
      }
    }
    else if ((long)in_EDI < GA[in_RSI].num_rstrctd) {
      local_138 = (long)GA[in_RSI].ndim;
      local_140 = 0;
      in_stack_fffffffffffffee0 = (char *)0x1;
      for (lVar3 = 0; lVar3 < local_138; lVar3 = lVar3 + 1) {
        in_stack_fffffffffffffee0 =
             (char *)((long)GA[in_RSI].nblock[lVar3] * (long)in_stack_fffffffffffffee0);
      }
      if (((long)(in_stack_fffffffffffffee0 + -1) < (long)in_EDI) || (in_EDI < 0)) {
        for (in_stack_fffffffffffffed8 = 0; in_stack_fffffffffffffed8 < local_138;
            in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 1) {
          local_88[in_stack_fffffffffffffed8] = 0;
          local_c8[in_stack_fffffffffffffed8] = -1;
        }
      }
      else {
        local_130 = (long)in_EDI;
        for (in_stack_fffffffffffffed8 = 0; in_stack_fffffffffffffed8 < local_138;
            in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 1) {
          lVar3 = local_130 % (long)GA[local_10].nblock[in_stack_fffffffffffffed8];
          local_130 = local_130 / (long)GA[local_10].nblock[in_stack_fffffffffffffed8];
          local_148 = lVar3 + local_140;
          local_140 = GA[local_10].nblock[in_stack_fffffffffffffed8] + local_140;
          local_88[in_stack_fffffffffffffed8] = GA[local_10].mapc[local_148];
          if (lVar3 == GA[local_10].nblock[in_stack_fffffffffffffed8] + -1) {
            local_c8[in_stack_fffffffffffffed8] = GA[local_10].dims[in_stack_fffffffffffffed8];
          }
          else {
            local_c8[in_stack_fffffffffffffed8] = GA[local_10].mapc[local_148 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[in_RSI].ndim;
      local_150 = (int)sVar1;
      for (local_14c = 0; local_14c < sVar1; local_14c = local_14c + 1) {
        local_88[local_14c] = 0;
        local_c8[local_14c] = -1;
      }
    }
  }
  else if (((GA[in_RSI].distr_type == 1) || (GA[in_RSI].distr_type == 2)) ||
          (GA[in_RSI].distr_type == 3)) {
    sVar1 = GA[in_RSI].ndim;
    local_180 = (int)sVar1;
    sVar2 = GA[in_RSI].ndim;
    local_18c = (int)sVar2;
    local_178[0] = (int)((long)in_EDI % GA[in_RSI].num_blocks[0]);
    local_184 = in_EDI;
    for (local_188 = 1; local_188 < sVar2; local_188 = local_188 + 1) {
      local_184 = (int)((long)(local_184 - local_178[local_188 + -1]) /
                       GA[local_10].num_blocks[local_188 + -1]);
      local_178[local_188] = (int)((long)local_184 % GA[local_10].num_blocks[local_188]);
    }
    for (local_17c = 0; local_17c < sVar1; local_17c = local_17c + 1) {
      local_88[local_17c] = (long)local_178[local_17c] * GA[local_10].block_dims[local_17c] + 1;
      local_c8[local_17c] = (long)(local_178[local_17c] + 1) * GA[local_10].block_dims[local_17c];
      if (GA[local_10].dims[local_17c] < local_c8[local_17c]) {
        local_c8[local_17c] = GA[local_10].dims[local_17c];
      }
    }
  }
  else if (GA[in_RSI].distr_type == 4) {
    local_1b0 = (int)GA[in_RSI].ndim;
    local_1b4 = 0;
    local_1c0 = (int)GA[in_RSI].ndim;
    local_1a8[0] = (int)((long)in_EDI % GA[in_RSI].num_blocks[0]);
    local_1b8 = in_EDI;
    for (local_1bc = 1; local_1bc < local_1c0; local_1bc = local_1bc + 1) {
      local_1b8 = (int)((long)(local_1b8 - local_1a8[local_1bc + -1]) /
                       GA[local_10].num_blocks[local_1bc + -1]);
      local_1a8[local_1bc] = (int)((long)local_1b8 % GA[local_10].num_blocks[local_1bc]);
    }
    for (local_1ac = 0; local_1ac < local_1b0; local_1ac = local_1ac + 1) {
      local_88[local_1ac] = GA[local_10].mapc[local_1b4 + local_1a8[local_1ac]];
      if ((long)local_1a8[local_1ac] < GA[local_10].num_blocks[local_1ac] + -1) {
        local_c8[local_1ac] = GA[local_10].mapc[local_1b4 + local_1a8[local_1ac] + 1] + -1;
      }
      else {
        local_c8[local_1ac] = GA[local_10].dims[local_1ac];
      }
      local_1b4 = local_1b4 + (int)GA[local_10].num_blocks[local_1ac];
    }
  }
  for (local_1c8 = 0; (long)local_1c8 < (long)GA[local_10].ndim; local_1c8 = local_1c8 + 1) {
    if ((*(long *)(local_18 + local_1c8 * 8) < local_88[local_1c8]) ||
       (local_c8[local_1c8] < *(long *)(local_18 + local_1c8 * 8))) {
      sprintf(acStackY_2c8,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
              *(undefined8 *)(local_18 + local_1c8 * 8),local_88[local_1c8],local_c8[local_1c8],
              local_1c8 & 0xffffffff);
      pnga_error(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
  }
  if (local_50 == 0) {
    *local_28 = (local_c8[0] - local_88[0]) + 1 + GA[local_10].width[0] * 2;
  }
  for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
    local_40 = GA[local_10].width[local_38];
    local_30 = ((*(long *)(local_18 + local_38 * 8) - local_88[local_38]) + local_40) * local_48 +
               local_30;
    local_28[local_38] = (local_c8[local_38] - local_88[local_38]) + 1 + local_40 * 2;
    local_48 = local_28[local_38] * local_48;
  }
  if (GA[local_10].p_handle == 0) {
    local_d0 = (long)PGRP_LIST->inv_map_proc_list[local_4];
  }
  else if (GA[local_10].num_rstrctd == 0) {
    local_d0 = (long)local_4;
  }
  else {
    local_d0 = GA[local_10].rstrctd_list[local_4];
  }
  *local_20 = GA[local_10].ptr[local_d0] +
              (((*(long *)(local_18 + local_50 * 8) - local_88[local_50]) +
               GA[local_10].width[local_50]) * local_48 + local_30) * (long)GA[local_10].elemsize;
  return;
}

Assistant:

void gam_LocationF(int proc, Integer g_handle,  Integer subscript[],
    char **ptr_loc, Integer ld[])
{                                                                          
  Integer _offset=0, _d, _w, _factor=1, _last=GA[g_handle].ndim-1;         
  Integer _lo[MAXDIM], _hi[MAXDIM], _pinv, _p_handle;                     
                                                                           
  ga_ownsM(g_handle, proc, _lo, _hi);                                      
  gaCheckSubscriptM(subscript, _lo, _hi, GA[g_handle].ndim);               
  if(_last==0) ld[0]=_hi[0]- _lo[0]+1+2*(Integer)GA[g_handle].width[0];   
  for(_d=0; _d < _last; _d++)            {                                 
    _w = (Integer)GA[g_handle].width[_d];                                  
    _offset += (subscript[_d]-_lo[_d]+_w) * _factor;                       
    ld[_d] = _hi[_d] - _lo[_d] + 1 + 2*_w;                                 
    _factor *= ld[_d];                                                     
  }                                                                        
  _offset += (subscript[_last]-_lo[_last]                                  
      + (Integer)GA[g_handle].width[_last])                                
  * _factor;                                                               
  _p_handle = GA[g_handle].p_handle;                                       
  if (_p_handle != 0) {                                                    
    if (GA[g_handle].num_rstrctd == 0) {                                   
      _pinv = proc;                                                        
    } else {                                                               
      _pinv = GA[g_handle].rstrctd_list[proc];                             
    }                                                                      
  } else {                                                                 
    _pinv = PGRP_LIST[_p_handle].inv_map_proc_list[proc];                  
  }                                                                       
  *(ptr_loc) =  GA[g_handle].ptr[_pinv]+_offset*GA[g_handle].elemsize;    
}